

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEnumerated.c
# Opt level: O1

asn_enc_rval_t *
NativeEnumerated_encode_xer
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,int ilevel,
          xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  asn_app_consume_bytes_f *paVar4;
  int iVar5;
  int iVar6;
  asn_INTEGER_enum_map_t *paVar7;
  undefined8 uStack_40;
  asn_app_consume_bytes_f *local_38;
  
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
  }
  else {
    uStack_40 = 0x141216;
    paVar7 = INTEGER_map_value2enum((asn_INTEGER_specifics_t *)td->specifics,*sptr);
    if (paVar7 != (asn_INTEGER_enum_map_t *)0x0) {
      sVar1 = paVar7->enum_len;
      lVar3 = -(sVar1 + 0x14 & 0xfffffffffffffff0);
      pcVar2 = paVar7->enum_name;
      local_38 = cb;
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x14124d;
      iVar5 = snprintf((char *)((long)&local_38 + lVar3),sVar1 + 5,"<%s/>",pcVar2);
      paVar4 = local_38;
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x14125d;
      iVar6 = (*paVar4)((char *)((long)&local_38 + lVar3),(long)iVar5,app_key);
      if (-1 < iVar6) {
        __return_storage_ptr__->encoded = (long)iVar5;
        __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
        __return_storage_ptr__->structure_ptr = (void *)0x0;
        return __return_storage_ptr__;
      }
    }
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
NativeEnumerated_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
        int ilevel, enum xer_encoder_flags_e flags,
                asn_app_consume_bytes_f *cb, void *app_key) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
        asn_enc_rval_t er;
        const long *native = (const long *)sptr;
	const asn_INTEGER_enum_map_t *el;

        (void)ilevel;
        (void)flags;

        if(!native) ASN__ENCODE_FAILED;

	el = INTEGER_map_value2enum(specs, *native);
	if(el) {
		size_t srcsize = el->enum_len + 5;
		char *src = (char *)alloca(srcsize);

		er.encoded = snprintf(src, srcsize, "<%s/>", el->enum_name);
		assert(er.encoded > 0 && (size_t)er.encoded < srcsize);
		if(cb(src, er.encoded, app_key) < 0) ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	} else {
		ASN_DEBUG("ASN.1 forbids dealing with "
			"unknown value of ENUMERATED type");
		ASN__ENCODE_FAILED;
	}
}